

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expendable.cpp
# Opt level: O0

bool __thiscall DIS::Expendable::operator==(Expendable *this,Expendable *rhs)

{
  bool local_19;
  bool ivarsEqual;
  Expendable *rhs_local;
  Expendable *this_local;
  
  local_19 = EntityType::operator==(&this->_expendable,&rhs->_expendable);
  if (this->_station != rhs->_station) {
    local_19 = false;
  }
  if (this->_quantity != rhs->_quantity) {
    local_19 = false;
  }
  if (this->_expendableStatus != rhs->_expendableStatus) {
    local_19 = false;
  }
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool Expendable::operator ==(const Expendable& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_expendable == rhs._expendable) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_quantity == rhs._quantity) ) ivarsEqual = false;
     if( ! (_expendableStatus == rhs._expendableStatus) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }